

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear_glfw_gl3.h
# Opt level: O0

void nk_glfw3_render(nk_glfw *glfw,nk_anti_aliasing AA,int max_vertex_buffer,int max_element_buffer)

{
  int in_ECX;
  int in_EDX;
  undefined4 in_ESI;
  long in_RDI;
  nk_convert_config config;
  nk_draw_index *offset;
  void *elements;
  void *vertices;
  nk_draw_command *cmd;
  GLfloat ortho [4] [4];
  nk_buffer ebuf;
  nk_buffer vbuf;
  nk_glfw_device *dev;
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  nk_context *ctx;
  void *local_178;
  nk_draw_command *local_160;
  float local_158 [5];
  float local_144;
  undefined4 local_130;
  undefined4 local_128;
  undefined4 local_124;
  undefined4 local_11c;
  nk_buffer *local_20;
  int local_14;
  int local_10;
  undefined4 local_c;
  long local_8;
  
  local_20 = (nk_buffer *)(in_RDI + 0x18);
  local_14 = in_ECX;
  local_10 = in_EDX;
  local_c = in_ESI;
  local_8 = in_RDI;
  memset(local_158,0,0x40);
  local_130 = 0xbf800000;
  local_128 = 0xbf800000;
  local_124 = 0x3f800000;
  local_11c = 0x3f800000;
  local_158[0] = 2.0 / (float)*(int *)(local_8 + 8);
  local_144 = -2.0 / (float)*(int *)(local_8 + 0xc);
  (*glad_glEnable)(0xbe2);
  (*glad_glBlendEquation)(0x8006);
  (*glad_glBlendFunc)(0x302,0x303);
  (*glad_glDisable)(0xb44);
  (*glad_glDisable)(0xb71);
  (*glad_glEnable)(0xc11);
  (*glad_glActiveTexture)(0x84c0);
  (*glad_glUseProgram)(*(GLuint *)((long)&local_20[1].marker[1].offset + 4));
  (*glad_glUniform1i)(*(GLint *)((long)&local_20[1].pool.free + 4),0);
  (*glad_glUniformMatrix4fv)(local_20[1].type,1,'\0',local_158);
  (*glad_glViewport)(0,0,*(GLsizei *)(local_8 + 0x10),*(GLsizei *)(local_8 + 0x14));
  local_178 = (void *)0x0;
  (*glad_glBindVertexArray)(*(GLuint *)&local_20[1].marker[1].field_0x4);
  (*glad_glBindBuffer)(0x8892,local_20[1].marker[1].active);
  (*glad_glBindBuffer)(0x8893,(GLuint)local_20[1].marker[1].offset);
  (*glad_glBufferData)(0x8892,(long)local_10,(void *)0x0,0x88e0);
  (*glad_glBufferData)(0x8893,(long)local_14,(void *)0x0,0x88e0);
  (*glad_glMapBuffer)(0x8892,0x88b9);
  (*glad_glMapBuffer)(0x8893,0x88b9);
  nk_memset(&stack0xfffffffffffffe48,0,0x40);
  ctx = *(nk_context **)local_20[1].marker;
  uVar4 = 0x16;
  uVar1 = 0x3f800000;
  uVar3 = local_c;
  nk_buffer_init_fixed
            ((nk_buffer *)CONCAT44(0x16,local_c),(void *)CONCAT44(local_c,0x3f800000),0x146192);
  nk_buffer_init_fixed((nk_buffer *)CONCAT44(uVar4,uVar3),(void *)CONCAT44(local_c,uVar1),0x1461ac);
  nk_convert((nk_context *)ebuf.memory.ptr,(nk_buffer *)ebuf._56_8_,(nk_buffer *)ebuf.pool.free,
             (nk_buffer *)ebuf.pool.alloc,(nk_convert_config *)ebuf.pool.userdata.ptr);
  (*glad_glUnmapBuffer)(0x8892);
  (*glad_glUnmapBuffer)(0x8893);
  local_160 = nk__draw_begin((nk_context *)CONCAT44(uVar4,uVar3),
                             (nk_buffer *)CONCAT44(local_c,uVar1));
  uVar2 = local_c;
  while (local_160 != (nk_draw_command *)0x0) {
    if (local_160->elem_count != 0) {
      (*glad_glBindTexture)(0xde1,(local_160->texture).id);
      (*glad_glScissor)((int)((local_160->clip_rect).x * *(float *)(local_8 + 0x4350)),
                        (int)((float)(*(int *)(local_8 + 0xc) -
                                     (int)((local_160->clip_rect).y + (local_160->clip_rect).h)) *
                             *(float *)(local_8 + 0x4354)),
                        (int)((local_160->clip_rect).w * *(float *)(local_8 + 0x4350)),
                        (int)((local_160->clip_rect).h * *(float *)(local_8 + 0x4354)));
      (*glad_glDrawElements)(4,local_160->elem_count,0x1403,local_178);
      local_178 = (void *)((long)local_178 + (ulong)local_160->elem_count * 2);
    }
    local_160 = nk__draw_next((nk_draw_command *)CONCAT44(uVar4,uVar3),
                              (nk_buffer *)CONCAT44(uVar2,uVar1),(nk_context *)0x14634b);
  }
  nk_clear(ctx);
  nk_buffer_clear(local_20);
  (*glad_glUseProgram)(0);
  (*glad_glBindBuffer)(0x8892,0);
  (*glad_glBindBuffer)(0x8893,0);
  (*glad_glBindVertexArray)(0);
  (*glad_glDisable)(0xbe2);
  (*glad_glDisable)(0xc11);
  return;
}

Assistant:

NK_API void
nk_glfw3_render(struct nk_glfw* glfw, enum nk_anti_aliasing AA, int max_vertex_buffer, int max_element_buffer)
{
    struct nk_glfw_device *dev = &glfw->ogl;
    struct nk_buffer vbuf, ebuf;
    GLfloat ortho[4][4] = {
        {2.0f, 0.0f, 0.0f, 0.0f},
        {0.0f,-2.0f, 0.0f, 0.0f},
        {0.0f, 0.0f,-1.0f, 0.0f},
        {-1.0f,1.0f, 0.0f, 1.0f},
    };
    ortho[0][0] /= (GLfloat)glfw->width;
    ortho[1][1] /= (GLfloat)glfw->height;

    /* setup global state */
    glEnable(GL_BLEND);
    glBlendEquation(GL_FUNC_ADD);
    glBlendFunc(GL_SRC_ALPHA, GL_ONE_MINUS_SRC_ALPHA);
    glDisable(GL_CULL_FACE);
    glDisable(GL_DEPTH_TEST);
    glEnable(GL_SCISSOR_TEST);
    glActiveTexture(GL_TEXTURE0);

    /* setup program */
    glUseProgram(dev->prog);
    glUniform1i(dev->uniform_tex, 0);
    glUniformMatrix4fv(dev->uniform_proj, 1, GL_FALSE, &ortho[0][0]);
    glViewport(0,0,(GLsizei)glfw->display_width,(GLsizei)glfw->display_height);
    {
        /* convert from command queue into draw list and draw to screen */
        const struct nk_draw_command *cmd;
        void *vertices, *elements;
        const nk_draw_index *offset = NULL;

        /* allocate vertex and element buffer */
        glBindVertexArray(dev->vao);
        glBindBuffer(GL_ARRAY_BUFFER, dev->vbo);
        glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, dev->ebo);

        glBufferData(GL_ARRAY_BUFFER, max_vertex_buffer, NULL, GL_STREAM_DRAW);
        glBufferData(GL_ELEMENT_ARRAY_BUFFER, max_element_buffer, NULL, GL_STREAM_DRAW);

        /* load draw vertices & elements directly into vertex + element buffer */
        vertices = glMapBuffer(GL_ARRAY_BUFFER, GL_WRITE_ONLY);
        elements = glMapBuffer(GL_ELEMENT_ARRAY_BUFFER, GL_WRITE_ONLY);
        {
            /* fill convert configuration */
            struct nk_convert_config config;
            static const struct nk_draw_vertex_layout_element vertex_layout[] = {
                {NK_VERTEX_POSITION, NK_FORMAT_FLOAT, NK_OFFSETOF(struct nk_glfw_vertex, position)},
                {NK_VERTEX_TEXCOORD, NK_FORMAT_FLOAT, NK_OFFSETOF(struct nk_glfw_vertex, uv)},
                {NK_VERTEX_COLOR, NK_FORMAT_R8G8B8A8, NK_OFFSETOF(struct nk_glfw_vertex, col)},
                {NK_VERTEX_LAYOUT_END}
            };
            NK_MEMSET(&config, 0, sizeof(config));
            config.vertex_layout = vertex_layout;
            config.vertex_size = sizeof(struct nk_glfw_vertex);
            config.vertex_alignment = NK_ALIGNOF(struct nk_glfw_vertex);
            config.null = dev->null;
            config.circle_segment_count = 22;
            config.curve_segment_count = 22;
            config.arc_segment_count = 22;
            config.global_alpha = 1.0f;
            config.shape_AA = AA;
            config.line_AA = AA;

            /* setup buffers to load vertices and elements */
            nk_buffer_init_fixed(&vbuf, vertices, (size_t)max_vertex_buffer);
            nk_buffer_init_fixed(&ebuf, elements, (size_t)max_element_buffer);
            nk_convert(&glfw->ctx, &dev->cmds, &vbuf, &ebuf, &config);
        }
        glUnmapBuffer(GL_ARRAY_BUFFER);
        glUnmapBuffer(GL_ELEMENT_ARRAY_BUFFER);

        /* iterate over and execute each draw command */
        nk_draw_foreach(cmd, &glfw->ctx, &dev->cmds)
        {
            if (!cmd->elem_count) continue;
            glBindTexture(GL_TEXTURE_2D, (GLuint)cmd->texture.id);
            glScissor(
                (GLint)(cmd->clip_rect.x * glfw->fb_scale.x),
                (GLint)((glfw->height - (GLint)(cmd->clip_rect.y + cmd->clip_rect.h)) * glfw->fb_scale.y),
                (GLint)(cmd->clip_rect.w * glfw->fb_scale.x),
                (GLint)(cmd->clip_rect.h * glfw->fb_scale.y));
            glDrawElements(GL_TRIANGLES, (GLsizei)cmd->elem_count, GL_UNSIGNED_SHORT, offset);
            offset += cmd->elem_count;
        }
        nk_clear(&glfw->ctx);
        nk_buffer_clear(&dev->cmds);
    }

    /* default OpenGL state */
    glUseProgram(0);
    glBindBuffer(GL_ARRAY_BUFFER, 0);
    glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, 0);
    glBindVertexArray(0);
    glDisable(GL_BLEND);
    glDisable(GL_SCISSOR_TEST);
}